

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O0

uint64_t helper_neon_sqadd_u64_aarch64(CPUARMState_conflict *env,uint64_t a,uint64_t b)

{
  ulong local_28;
  uint64_t res;
  uint64_t b_local;
  uint64_t a_local;
  CPUARMState_conflict *env_local;
  
  local_28 = a + b;
  if (((local_28 & (a | b ^ 0xffffffffffffffff) | a & (b ^ 0xffffffffffffffff)) & 0x8000000000000000
      ) != 0) {
    (env->vfp).qc[0] = 1;
    local_28 = 0x7fffffffffffffff;
  }
  return local_28;
}

Assistant:

uint64_t HELPER(neon_sqadd_u64)(CPUARMState *env, uint64_t a, uint64_t b)
{
    uint64_t res;
    res = a + b;
    /* We only need to look at the pattern of SIGN bits to detect an overflow */
    if (((a & res)
         | (~b & res)
         | (a & ~b)) & SIGNBIT64) {
        SET_QC();
        res = INT64_MAX;
    }
    return res;
}